

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

APInt * __thiscall llvm::APInt::operator&=(APInt *this,APInt *RHS)

{
  uint uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  
  uVar1 = this->BitWidth;
  if (uVar1 == RHS->BitWidth) {
    if (uVar1 < 0x41) {
      (this->U).VAL = (this->U).VAL & (RHS->U).VAL;
    }
    else {
      puVar2 = (this->U).pVal;
      puVar3 = (RHS->U).pVal;
      uVar4 = 0;
      do {
        puVar2[uVar4] = puVar2[uVar4] & puVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while ((ulong)uVar1 + 0x3f >> 6 != uVar4);
    }
    return this;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x318,"APInt &llvm::APInt::operator&=(const APInt &)");
}

Assistant:

APInt &operator&=(const APInt &RHS) {
    assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
    if (isSingleWord())
      U.VAL &= RHS.U.VAL;
    else
      AndAssignSlowCase(RHS);
    return *this;
  }